

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Args.cpp
# Opt level: O0

bool idx2::OptVal(int NArgs,cstr *Args,cstr Opt,v3<idx2::t2<char,_int>_> *Val)

{
  int iVar1;
  size_t sVar2;
  bool local_13a;
  bool local_11a;
  anon_union_8_2_2df48d06_for_stref_0 local_f0;
  undefined4 local_e8;
  anon_union_8_2_2df48d06_for_stref_0 local_e0;
  undefined4 local_d8;
  anon_union_8_2_2df48d06_for_stref_0 local_d0;
  undefined4 local_c8;
  bool local_bd;
  int local_bc;
  bool Success;
  v3<idx2::t2<char,_int>_> *pvStack_b8;
  int I;
  v3<idx2::t2<char,_int>_> *Val_local;
  cstr Opt_local;
  cstr *Args_local;
  int NArgs_local;
  anon_union_8_2_2df48d06_for_stref_0 *local_90;
  anon_union_8_2_2df48d06_for_stref_0 local_88;
  anon_union_8_2_2df48d06_for_stref_0 *local_80;
  anon_union_8_2_2df48d06_for_stref_0 local_78;
  anon_union_8_2_2df48d06_for_stref_0 *local_70;
  undefined4 local_64;
  v3<idx2::t2<char,_int>_> *local_60;
  undefined4 local_54;
  v3<idx2::t2<char,_int>_> *local_50;
  undefined4 local_44;
  v3<idx2::t2<char,_int>_> *local_40;
  undefined4 local_34;
  v3<idx2::t2<char,_int>_> *local_30;
  undefined4 local_24;
  v3<idx2::t2<char,_int>_> *local_20;
  undefined4 local_14;
  v3<idx2::t2<char,_int>_> *local_10;
  
  local_bc = 1;
  pvStack_b8 = Val;
  Val_local = (v3<idx2::t2<char,_int>_> *)Opt;
  Opt_local = (cstr)Args;
  Args_local._0_4_ = NArgs;
  while( true ) {
    if ((int)Args_local <= local_bc + 5) {
      return false;
    }
    iVar1 = strncmp(*(char **)(Opt_local + (long)local_bc * 8),(char *)Val_local,0x20);
    if (iVar1 == 0) break;
    local_bc = local_bc + 1;
  }
  local_bd = true;
  local_10 = pvStack_b8;
  local_14 = 0;
  (pvStack_b8->field_0).field_0.X.First = **(char **)(Opt_local + (long)(local_bc + 1) * 8);
  _NArgs_local = (anon_union_8_2_2df48d06_for_stref_0)
                 ((anon_union_8_2_2df48d06_for_stref_0 *)(Opt_local + (long)(local_bc + 2) * 8))->
                 Ptr;
  local_90 = &local_d0;
  local_d0 = _NArgs_local;
  sVar2 = strlen(_NArgs_local);
  local_c8 = (undefined4)sVar2;
  local_20 = pvStack_b8;
  local_24 = 0;
  local_bd = ToInt((stref *)&local_d0,&(pvStack_b8->field_0).E[0].Second);
  local_30 = pvStack_b8;
  local_34 = 1;
  (pvStack_b8->field_0).field_0.Y.First = **(char **)(Opt_local + (long)(local_bc + 2) * 8);
  local_11a = false;
  if (local_bd) {
    local_88 = (anon_union_8_2_2df48d06_for_stref_0)
               ((anon_union_8_2_2df48d06_for_stref_0 *)(Opt_local + (long)(local_bc + 3) * 8))->Ptr;
    local_80 = &local_e0;
    local_e0 = local_88;
    sVar2 = strlen(local_88.Ptr);
    local_d8 = (undefined4)sVar2;
    local_40 = pvStack_b8;
    local_44 = 1;
    local_11a = ToInt((stref *)&local_e0,&(pvStack_b8->field_0).E[1].Second);
  }
  local_bd = local_11a;
  local_50 = pvStack_b8;
  local_54 = 2;
  (pvStack_b8->field_0).field_0.Z.First = **(char **)(Opt_local + (long)(local_bc + 4) * 8);
  local_13a = false;
  if (local_11a != false) {
    local_78 = (anon_union_8_2_2df48d06_for_stref_0)
               ((anon_union_8_2_2df48d06_for_stref_0 *)(Opt_local + (long)(local_bc + 5) * 8))->Ptr;
    local_70 = &local_f0;
    local_f0 = local_78;
    sVar2 = strlen(local_78.Ptr);
    local_e8 = (undefined4)sVar2;
    local_60 = pvStack_b8;
    local_64 = 2;
    local_13a = ToInt((stref *)&local_f0,&(pvStack_b8->field_0).E[2].Second);
  }
  return local_13a;
}

Assistant:

bool
OptVal(int NArgs, cstr* Args, cstr Opt, v3<t2<char, int>>* Val)
{
  for (int I = 1; I + 5 < NArgs; ++I)
  {
    if (strncmp(Args[I], Opt, 32) == 0)
    {
      bool Success = true;
      (*Val)[0].First = Args[I + 1][0];
      Success = Success && ToInt(Args[I + 2], &(*Val)[0].Second);
      (*Val)[1].First = Args[I + 2][0];
      Success = Success && ToInt(Args[I + 3], &(*Val)[1].Second);
      (*Val)[2].First = Args[I + 4][0];
      Success = Success && ToInt(Args[I + 5], &(*Val)[2].Second);
      return Success;
    }
  }

  return false;
}